

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaLut::apply(RgbaLut *this,Rgba *data,int nData,int stride)

{
  half hVar1;
  int in_ECX;
  int in_EDX;
  uint16_t *in_RSI;
  long in_RDI;
  halfFunction<Imath_3_2::half> *in_stack_ffffffffffffffc8;
  int local_14;
  uint16_t *local_10;
  
  local_10 = in_RSI;
  for (local_14 = in_EDX; local_14 != 0; local_14 = local_14 + -1) {
    if ((*(uint *)(in_RDI + 8) & 1) != 0) {
      hVar1 = halfFunction<Imath_3_2::half>::operator()
                        (in_stack_ffffffffffffffc8,(uint16_t)((ulong)in_RDI >> 0x20));
      *local_10 = hVar1._h;
    }
    if ((*(uint *)(in_RDI + 8) & 2) != 0) {
      hVar1 = halfFunction<Imath_3_2::half>::operator()
                        (in_stack_ffffffffffffffc8,(uint16_t)((ulong)in_RDI >> 0x20));
      local_10[1] = hVar1._h;
    }
    if ((*(uint *)(in_RDI + 8) & 4) != 0) {
      hVar1 = halfFunction<Imath_3_2::half>::operator()
                        (in_stack_ffffffffffffffc8,(uint16_t)((ulong)in_RDI >> 0x20));
      local_10[2] = hVar1._h;
    }
    if ((*(uint *)(in_RDI + 8) & 8) != 0) {
      hVar1 = halfFunction<Imath_3_2::half>::operator()
                        (in_stack_ffffffffffffffc8,(uint16_t)((ulong)in_RDI >> 0x20));
      local_10[3] = hVar1._h;
    }
    local_10 = local_10 + (long)in_ECX * 4;
  }
  return;
}

Assistant:

void
RgbaLut::apply (Rgba* data, int nData, int stride) const
{
    while (nData)
    {
        if (_chn & WRITE_R) data->r = _lut (data->r);

        if (_chn & WRITE_G) data->g = _lut (data->g);

        if (_chn & WRITE_B) data->b = _lut (data->b);

        if (_chn & WRITE_A) data->a = _lut (data->a);

        data += stride;
        nData -= 1;
    }
}